

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple(Aig_Man_t *pMiter,Vec_Int_t *vPairs)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Ssw_Cla_t *p;
  Aig_Obj_t **ppAVar4;
  long lVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  
  p = Ssw_ClassesStart(pMiter);
  uVar8 = (ulong)vPairs->nSize;
  ppAVar4 = (Aig_Obj_t **)malloc(uVar8 * 8);
  p->pMemClasses = ppAVar4;
  if (0 < (long)uVar8) {
    lVar5 = 1;
    do {
      pVVar3 = pMiter->vObjs;
      if (pVVar3 == (Vec_Ptr_t *)0x0) {
        if ((int)uVar8 <= lVar5) {
LAB_00924645:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        pAVar6 = (Aig_Obj_t *)0x0;
        pAVar7 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar1 = vPairs->pArray[lVar5 + -1];
        if (((int)uVar1 < 0) || (pVVar3->nSize <= (int)uVar1)) {
LAB_009245aa:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if ((int)uVar8 <= lVar5) goto LAB_00924645;
        iVar2 = vPairs->pArray[lVar5];
        if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) goto LAB_009245aa;
        pAVar6 = (Aig_Obj_t *)pVVar3->pArray[uVar1];
        pAVar7 = (Aig_Obj_t *)pVVar3->pArray[iVar2];
      }
      iVar2 = pAVar6->Id;
      if (pAVar7->Id <= iVar2) {
        __assert_fail("Aig_ObjId(pRepr) < Aig_ObjId(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x3af,"Ssw_Cla_t *Ssw_ClassesPreparePairsSimple(Aig_Man_t *, Vec_Int_t *)");
      }
      if (pMiter->pReprs == (Aig_Obj_t **)0x0) {
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pMiter->pReprs[pAVar7->Id] = pAVar6;
      *ppAVar4 = pAVar6;
      ppAVar4[1] = pAVar7;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
        __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pId2Class[iVar2] = ppAVar4;
      if (p->pClassSizes[iVar2] != 0) {
        __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pClassSizes[iVar2] = 2;
      p->nClasses = p->nClasses + 1;
      p->nLits = p->nLits + 1;
      uVar8 = (ulong)(uint)vPairs->nSize;
      ppAVar4 = ppAVar4 + 2;
      iVar2 = (int)lVar5;
      lVar5 = lVar5 + 2;
    } while (iVar2 + 1 < vPairs->nSize);
  }
  p->pMemClassesFree = (Aig_Obj_t **)0x0;
  Ssw_ClassesCheck(p);
  return p;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPreparePairsSimple( Aig_Man_t * pMiter, Vec_Int_t * vPairs )
{
    Ssw_Cla_t * p;
    Aig_Obj_t ** ppClassNew;
    Aig_Obj_t * pObj, * pRepr;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pMiter );
    // allocate memory for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_IntSize(vPairs) );
    // create classes
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        pRepr = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i) );
        pObj  = Aig_ManObj( pMiter, Vec_IntEntry(vPairs, i+1) );
        assert( Aig_ObjId(pRepr) < Aig_ObjId(pObj) );
        Aig_ObjSetRepr( pMiter, pObj, pRepr );
        // get room for storing the class
        ppClassNew = p->pMemClasses + i;
        ppClassNew[0] = pRepr;
        ppClassNew[1] = pObj;
        // create new class
        Ssw_ObjAddClass( p, pRepr, ppClassNew, 2 );
    }
    // prepare room for new classes
    p->pMemClassesFree = NULL;
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}